

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeakForAllocationStage
          (MemoryLeakDetectorTable *this,uchar allocation_stage)

{
  MemoryLeakDetectorNode *pMVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (lVar2 + 8 == 0x250) {
      return (MemoryLeakDetectorNode *)0x0;
    }
    pMVar1 = MemoryLeakDetectorList::getFirstLeakForAllocationStage
                       ((MemoryLeakDetectorList *)((long)&this->table_[0].head_ + lVar2),
                        allocation_stage);
    lVar2 = lVar2 + 8;
  } while (pMVar1 == (MemoryLeakDetectorNode *)0x0);
  return pMVar1;
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeakForAllocationStage(unsigned char allocation_stage)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeakForAllocationStage(allocation_stage);
        if (node) return node;
    }
    return NULLPTR;
}